

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::ShutdownProcessPipe(CPalSynchronizationManager *this)

{
  int iVar1;
  PAL_ERROR local_14;
  PAL_ERROR palErr;
  CPalSynchronizationManager *this_local;
  
  local_14 = 0;
  if (this->m_iProcessPipeWrite != -1) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    iVar1 = close(this->m_iProcessPipeWrite);
    if (iVar1 == -1) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      local_14 = 0x54f;
    }
    this->m_iProcessPipeWrite = -1;
  }
  return local_14;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::ShutdownProcessPipe()
    {
        PAL_ERROR palErr = NO_ERROR;

        if (-1 != m_iProcessPipeWrite)
        {
            // Closing the write end of the process pipe. When the last process
            // that still has a open write-fd on this pipe will close it, the
            // worker thread will receive an EOF; the worker thread will wait
            // for this EOF before shutting down, so to ensure to process any
            // possible data already written to the pipe by other processes
            // when the shutdown has been initiated in the current process.
            // Note: no need here to worry about platforms where close(pipe)
            // blocks on outstanding syscalls, since we are the only one using
            // this fd.
            TRACE("Closing the write end of process pipe\n");
            if (close(m_iProcessPipeWrite) == -1)
            {
                ERROR("Unable to close the write end of process pipe\n");
                palErr = ERROR_INTERNAL_ERROR;
            }
            m_iProcessPipeWrite = -1;
        }

        return palErr;
    }